

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptNativeIntArray::NewInstance(RecyclableObject *function,Arguments *args)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  JavascriptLibrary *pJVar6;
  Var aValue;
  JavascriptNativeIntArray *pJVar7;
  double T1;
  JavascriptNativeIntArray *arr;
  uint32 uvalue;
  double value;
  int elementCount;
  Var firstArgument;
  JavascriptArray *pNew;
  CallInfo *callInfo;
  Arguments *args_local;
  RecyclableObject *function_local;
  
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,NativeArrayPhase);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x54f,
                                "(!Js::Configuration::Global.flags.Off.IsEnabled((NativeArrayPhase)))"
                                ,"!PHASE_OFF1(NativeArrayPhase)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  if ((SUB84(args->Info,0) & 0xffffff) < 2) {
    pJVar6 = RecyclableObject::GetLibrary(function);
    function_local = (RecyclableObject *)JavascriptLibrary::CreateNativeIntArray(pJVar6);
  }
  else {
    if ((SUB84(args->Info,0) & 0xffffff) == 2) {
      aValue = Arguments::operator[](args,1);
      bVar2 = TaggedInt::Is(aValue);
      if (bVar2) {
        uVar3 = TaggedInt::ToInt32(aValue);
        if ((int)uVar3 < 0) {
          pSVar5 = RecyclableObject::GetScriptContext(function);
          JavascriptError::ThrowRangeError(pSVar5,-0x7ff5ec5b,(PCWSTR)0x0);
        }
        pJVar6 = RecyclableObject::GetLibrary(function);
        firstArgument = JavascriptLibrary::CreateNativeIntArray(pJVar6,uVar3);
      }
      else {
        bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aValue);
        if (bVar2) {
          T1 = JavascriptNumber::GetValue(aValue);
          uVar3 = JavascriptConversion::ToUInt32(T1);
          if ((T1 != (double)uVar3) || (NAN(T1) || NAN((double)uVar3))) {
            pSVar5 = RecyclableObject::GetScriptContext(function);
            JavascriptError::ThrowRangeError(pSVar5,-0x7ff5ec5b,(PCWSTR)0x0);
          }
          pJVar6 = RecyclableObject::GetLibrary(function);
          firstArgument = JavascriptLibrary::CreateNativeIntArray(pJVar6,uVar3);
        }
        else {
          pJVar6 = RecyclableObject::GetLibrary(function);
          firstArgument = JavascriptLibrary::CreateArray(pJVar6,1);
          Js::JavascriptArray::DirectSetItemAt<void*>((JavascriptArray *)firstArgument,0,aValue);
        }
      }
    }
    else {
      pJVar6 = RecyclableObject::GetLibrary(function);
      pJVar7 = JavascriptLibrary::CreateNativeIntArray(pJVar6,(SUB84(args->Info,0) & 0xffffff) - 1);
      firstArgument =
           (Var)(**(code **)((long)(pJVar7->super_JavascriptNativeArray).super_JavascriptArray.
                                   super_ArrayObject.super_DynamicObject.super_RecyclableObject.
                                   super_FinalizableObject.super_IRecyclerVisitedObject + 0x3b0))
                          (pJVar7,(SUB84(args->Info,0) & 0xffffff) - 1,0,args->Values,0);
    }
    (**(code **)(*firstArgument + 0x3a0))();
    function_local = (RecyclableObject *)firstArgument;
  }
  return function_local;
}

Assistant:

Var JavascriptNativeIntArray::NewInstance(RecyclableObject* function, Arguments args)
    {
        Assert(!PHASE_OFF1(NativeArrayPhase));

        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        const CallInfo &callInfo = args.Info;
        if (callInfo.Count < 2)
        {
            // No arguments passed to Array(), so create with the default size (0).
            return function->GetLibrary()->CreateNativeIntArray();
        }

        JavascriptArray* pNew = nullptr;
        if (callInfo.Count == 2)
        {
            // Exactly one argument, which is the array length if it's a uint32.
            Var firstArgument = args[1];
            int elementCount;
            if (TaggedInt::Is(firstArgument))
            {
                elementCount = TaggedInt::ToInt32(firstArgument);
                if (elementCount < 0)
                {
                    JavascriptError::ThrowRangeError(
                        function->GetScriptContext(), JSERR_ArrayLengthConstructIncorrect);
                }
                pNew = function->GetLibrary()->CreateNativeIntArray(elementCount);
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(firstArgument))
            {
                // Non-tagged-int number: make sure the double value is really a uint32.
                double value = JavascriptNumber::GetValue(firstArgument);
                uint32 uvalue = JavascriptConversion::ToUInt32(value);
                if (value != uvalue)
                {
                    JavascriptError::ThrowRangeError(
                        function->GetScriptContext(), JSERR_ArrayLengthConstructIncorrect);
                }
                pNew = function->GetLibrary()->CreateNativeIntArray(uvalue);
            }
            else
            {
                //
                // First element is not int/double
                // create an array of length 1.
                // Set first element as the passed Var
                //

                pNew = function->GetLibrary()->CreateArray(1);
                pNew->DirectSetItemAt<Var>(0, firstArgument);
            }
        }
        else
        {
            // Called with a list of initial element values.
            // Create an array of the appropriate length and walk the list.

            JavascriptNativeIntArray *arr = function->GetLibrary()->CreateNativeIntArray(callInfo.Count - 1);
            pNew = arr->FillFromArgs(callInfo.Count - 1, 0, args.Values);
        }

#ifdef VALIDATE_ARRAY
        pNew->ValidateArray();
#endif

        return pNew;
    }